

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

uint8_t __thiscall wabt::ElemSegment::GetFlags(ElemSegment *this,Module *module)

{
  SegmentKind SVar1;
  Enum EVar2;
  Index IVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  bool local_41;
  byte local_19;
  Index table_index;
  bool all_ref_func;
  uint8_t flags;
  Module *module_local;
  ElemSegment *this_local;
  
  local_19 = 0;
  EVar2 = Type::operator_cast_to_Enum(&this->elem_type);
  SVar1 = this->kind;
  if (SVar1 == Active) {
    IVar3 = Module::GetTableIndex(module,&this->table_var);
    if (IVar3 != 0) {
      local_19 = 2;
    }
  }
  else if (SVar1 == Passive) {
    local_19 = 1;
  }
  else if (SVar1 == Declared) {
    local_19 = 3;
  }
  local_41 = false;
  if (EVar2 == FuncRef) {
    cVar4 = std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::begin(&this->elem_exprs);
    cVar5 = std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::end(&this->elem_exprs);
    local_41 = std::
               all_of<__gnu_cxx::__normal_iterator<wabt::ElemExpr_const*,std::vector<wabt::ElemExpr,std::allocator<wabt::ElemExpr>>>,wabt::ElemSegment::GetFlags(wabt::Module_const*)const::__0>
                         (cVar4._M_current,cVar5._M_current);
  }
  if (local_41 == false) {
    local_19 = local_19 | 4;
  }
  return local_19;
}

Assistant:

uint8_t ElemSegment::GetFlags(const Module* module) const {
  uint8_t flags = 0;

  bool all_ref_func = elem_type == Type::FuncRef;

  switch (kind) {
    case SegmentKind::Active: {
      Index table_index = module->GetTableIndex(table_var);
      if (table_index != 0) {
        flags |= SegExplicitIndex;
      }
      break;
    }

    case SegmentKind::Passive:
      flags |= SegPassive;
      break;

    case SegmentKind::Declared:
      flags |= SegDeclared;
      break;
  }

  all_ref_func = all_ref_func &&
                 std::all_of(elem_exprs.begin(), elem_exprs.end(),
                             [](const ElemExpr& elem_expr) {
                               return elem_expr.kind == ElemExprKind::RefFunc;
                             });
  if (!all_ref_func) {
    flags |= SegUseElemExprs;
  }

  return flags;
}